

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptExternalFunction * __thiscall
Js::JavascriptLibrary::CreateExternalFunction
          (JavascriptLibrary *this,ExternalMethod entryPoint,Var nameId,Var signature,UINT64 flags,
          bool isLengthAvailable)

{
  bool bVar1;
  int32 propertyId;
  DynamicType **ppDVar2;
  JavascriptExternalFunction *this_00;
  ScriptContext *this_01;
  ThreadContext *this_02;
  PropertyRecord *this_03;
  char16 *local_68;
  WriteBarrierPtr *local_58;
  JavascriptExternalFunction *function;
  bool isLengthAvailable_local;
  UINT64 flags_local;
  Var signature_local;
  Var nameId_local;
  ExternalMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  if (isLengthAvailable) {
    local_58 = (WriteBarrierPtr *)&this->externalFunctionWithLengthAndDeferredPrototypeType;
  }
  else {
    local_58 = (WriteBarrierPtr *)&this->externalFunctionWithDeferredPrototypeType;
  }
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__(local_58);
  this_00 = CreateIdMappedExternalFunction<void*(*)(Js::RecyclableObject*,Js::CallInfo,void**)>
                      (this,(_func_void_ptr_RecyclableObject_ptr_CallInfo_void_ptr_ptr *)entryPoint,
                       *ppDVar2);
  JavascriptExternalFunction::SetExternalFlags(this_00,flags);
  RuntimeFunction::SetFunctionNameId(&this_00->super_RuntimeFunction,nameId);
  JavascriptExternalFunction::SetSignature(this_00,signature);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,HostPhase);
  if (bVar1) {
    bVar1 = TaggedInt::Is(nameId);
    if (bVar1) {
      this_01 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                          (&(this->super_JavascriptLibraryBase).scriptContext);
      this_02 = ScriptContext::GetThreadContext(this_01);
      propertyId = TaggedInt::ToInt32(nameId);
      this_03 = ThreadContext::GetPropertyName(this_02,propertyId);
      local_68 = PropertyRecord::GetBuffer(this_03);
    }
    else {
      local_68 = JavascriptString::GetString((JavascriptString *)nameId);
    }
    Output::Print(L"Create new external function: methodAddr= %p, propertyRecord= %p, propertyName= %s\n"
                  ,this,nameId,local_68);
  }
  return this_00;
}

Assistant:

JavascriptExternalFunction*
    JavascriptLibrary::CreateExternalFunction(ExternalMethod entryPoint, Var nameId, Var signature, UINT64 flags, bool isLengthAvailable)
    {
        JavascriptExternalFunction* function = this->CreateIdMappedExternalFunction(entryPoint, isLengthAvailable ? externalFunctionWithLengthAndDeferredPrototypeType : externalFunctionWithDeferredPrototypeType);
        function->SetExternalFlags(flags);
        function->SetFunctionNameId(nameId);
        function->SetSignature(signature);
#ifdef HEAP_ENUMERATION_VALIDATION
        function->SetHeapEnumValidationCookie(HEAP_ENUMERATION_LIBRARY_OBJECT_COOKIE);
#endif

        JS_ETW_INTERNAL(EventWriteJSCRIPT_BUILD_DIRECT_FUNCTION(scriptContext, function, TaggedInt::Is(nameId) ? scriptContext->GetThreadContext()->GetPropertyName(TaggedInt::ToInt32(nameId))->GetBuffer() : ((JavascriptString *)nameId)->GetString()));
#if DBG_DUMP
        if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::HostPhase))
        {
            Output::Print(_u("Create new external function: methodAddr= %p, propertyRecord= %p, propertyName= %s\n"),
                this, nameId,
                TaggedInt::Is(nameId) ? scriptContext->GetThreadContext()->GetPropertyName(TaggedInt::ToInt32(nameId))->GetBuffer() : ((JavascriptString *)nameId)->GetString());
        }
#endif
        return function;
    }